

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransportParams.H
# Opt level: O0

void __thiscall
pele::physics::transport::TransportParams<pele::physics::transport::SimpleTransport>::sync_to_device
          (TransportParams<pele::physics::transport::SimpleTransport> *this)

{
  char *in_RDI;
  
  if ((in_RDI[0x4158] & 1U) == 0) {
    amrex::Abort_host(in_RDI);
  }
  else {
    amrex::Gpu::
    copy<pele::physics::transport::TransParm<pele::physics::eos::Fuego,pele::physics::transport::SimpleTransport>*,pele::physics::transport::TransParm<pele::physics::eos::Fuego,pele::physics::transport::SimpleTransport>*>
              (in_RDI,in_RDI + 0x4150,*(undefined8 *)(in_RDI + 0x4150));
  }
  return;
}

Assistant:

void sync_to_device()
  {
    if (!m_device_allocated) {
      amrex::Abort("Device params not allocated yet");
    } else {
      amrex::Gpu::copy(
        amrex::Gpu::hostToDevice, &m_h_trans_parm, &m_h_trans_parm + 1,
        m_d_trans_parm);
    }
  }